

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

QBitArray *
performBitwiseOperationInCopy<std::bit_and<unsigned_char>>(undefined8 param_1,undefined8 param_2)

{
  long lVar1;
  long in_FS_OFFSET;
  QBitArray tmp;
  QBitArray *in_stack_ffffffffffffff78;
  QBitArray *in_stack_ffffffffffffff80;
  QBitArray local_40;
  undefined1 *local_28;
  undefined1 *puStack_20;
  QBitArray *pQVar2;
  QBitArray *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QBitArray *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QBitArray::QBitArray(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  sizedForOverwrite(in_stack_fffffffffffffff0,pQVar2);
  QBitArray::operator=(&local_40,in_stack_ffffffffffffff78);
  QBitArray::~QBitArray((QBitArray *)0x589915);
  pQVar2 = performBitwiseOperationHelper<std::bit_and<unsigned_char>>(param_1,&local_28,param_2);
  QBitArray::~QBitArray((QBitArray *)0x58993a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE static
QBitArray &performBitwiseOperationInCopy(QBitArray &self, const QBitArray &other, BitwiseOp op)
{
    QBitArray tmp(std::move(self));
    self = sizedForOverwrite(tmp, other);
    return performBitwiseOperationHelper(self, tmp, other, op);
}